

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

int lyxml_print_fd(int fd,lyxml_elem *elem,int options)

{
  int iVar1;
  lyout local_48;
  
  iVar1 = 0;
  if (elem != (lyxml_elem *)0x0 && -1 < fd) {
    local_48.type = LYOUT_FD;
    local_48._4_4_ = 0;
    local_48.buf_size = 0;
    local_48.hole_count = 0;
    local_48.buffered = (char *)0x0;
    local_48.buf_len = 0;
    local_48.method.mem.len = 0;
    local_48.method.mem.size = 0;
    local_48.method._4_4_ = 0;
    local_48.method.fd = fd;
    if ((options & 0x10U) == 0) {
      iVar1 = dump_elem(&local_48,elem,0,options,1);
    }
    else {
      iVar1 = dump_siblings(&local_48,elem,options);
    }
  }
  return iVar1;
}

Assistant:

API int
lyxml_print_fd(int fd, const struct lyxml_elem *elem, int options)
{
    struct lyout out;

    if (fd < 0 || !elem) {
        return 0;
    }

    memset(&out, 0, sizeof out);

    out.type = LYOUT_FD;
    out.method.fd = fd;

    if (options & LYXML_PRINT_SIBLINGS) {
        return dump_siblings(&out, elem, options);
    } else {
        return dump_elem(&out, elem, 0, options, 1);
    }
}